

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O2

ps_search_t *
fsg_search_init(char *name,fsg_model_t *fsg,ps_config_t *config,acmod_t *acmod,dict_t *dict,
               dict2pid_t *d2p)

{
  logmath_t *plVar1;
  dict_t *pdVar2;
  dictword_t *pdVar3;
  int iVar4;
  s3wid_t sVar5;
  uint uVar6;
  ps_search_t *search;
  fsg_model_t *pfVar7;
  ps_searchfuncs_t *ppVar8;
  ps_search_t *ppVar9;
  ulong uVar10;
  ulong uVar11;
  char *altword;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  double dVar16;
  
  search = (ps_search_t *)
           __ckd_calloc__(1,0x130,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                          ,0xb6);
  ps_search_init(search,&fsg_funcs,"fsg",name,config,acmod,dict,d2p);
  pfVar7 = fsg_model_retain(fsg);
  search[1].type = (char *)pfVar7;
  ppVar8 = (ps_searchfuncs_t *)
           hmm_context_init(acmod->mdef->n_emit_state,acmod->tmat->tp,(int16 *)0x0,acmod->mdef->sseq
                           );
  search[1].vt = ppVar8;
  if (ppVar8 == (ps_searchfuncs_t *)0x0) {
    (*search->vt->free)(search);
  }
  else {
    lVar13 = 0;
    ppVar9 = (ps_search_t *)fsg_history_init((fsg_model_t *)0x0,dict);
    search[1].pls = ppVar9;
    search[1].post = -1;
    *(undefined4 *)((long)&search[1].d2p + 4) = 0x3f800000;
    plVar1 = acmod->lmath;
    dVar16 = ps_config_float(config,"beam");
    iVar4 = logmath_log(plVar1,(float64)dVar16);
    *(int *)&search[1].dict = iVar4 >> 10;
    *(int *)&search[1].hyp_str = iVar4 >> 10;
    plVar1 = acmod->lmath;
    dVar16 = ps_config_float(config,"pbeam");
    iVar4 = logmath_log(plVar1,(float64)dVar16);
    *(int *)((long)&search[1].dict + 4) = iVar4 >> 10;
    *(int *)((long)&search[1].hyp_str + 4) = iVar4 >> 10;
    plVar1 = acmod->lmath;
    dVar16 = ps_config_float(config,"wbeam");
    iVar4 = logmath_log(plVar1,(float64)dVar16);
    *(int *)&search[1].d2p = iVar4 >> 10;
    *(int *)&search[1].dag = iVar4 >> 10;
    dVar16 = ps_config_float(config,"lw");
    *(float *)((long)&search[1].dag + 4) = (float)dVar16;
    plVar1 = acmod->lmath;
    dVar16 = ps_config_float(config,"pip");
    iVar4 = logmath_log(plVar1,(float64)dVar16);
    *(int *)&search[1].last_link = (int)((float)iVar4 * *(float *)((long)&search[1].dag + 4)) >> 10;
    plVar1 = acmod->lmath;
    dVar16 = ps_config_float(config,"wip");
    iVar4 = logmath_log(plVar1,(float64)dVar16);
    *(int *)((long)&search[1].last_link + 4) =
         (int)((float)iVar4 * *(float *)((long)&search[1].dag + 4)) >> 10;
    dVar16 = ps_config_float(config,"ascale");
    search[1].start_wid = (int32)(float)(1.0 / dVar16);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,0xe0,"FSG(beam: %d, pbeam: %d, wbeam: %d; wip: %d, pip: %d)\n",
            (ulong)*(uint *)&search[1].dict,(ulong)*(uint *)((long)&search[1].dict + 4),
            (ulong)*(uint *)&search[1].d2p,(ulong)*(uint *)((long)&search[1].last_link + 4),
            (ulong)*(uint *)&search[1].last_link);
    pdVar2 = search->dict;
    do {
      if (fsg->n_word <= lVar13) {
        iVar4 = ps_config_bool(config,"fsgusefiller");
        if ((iVar4 != 0) && (fsg->silwords == (bitvec_t *)0x0)) {
          pdVar2 = search->dict;
          dVar16 = ps_config_float(search->config,"silprob");
          fsg_model_add_silence(fsg,"<sil>",-1,(float32)(float)dVar16);
          for (uVar12 = pdVar2->filler_start; (int)uVar12 < pdVar2->filler_end; uVar12 = uVar12 + 1)
          {
            if ((int)uVar12 < 0) {
              pcVar15 = (char *)0x0;
            }
            else {
              pcVar15 = pdVar2->word[uVar12].word;
            }
            if ((uVar12 != pdVar2->startwid) && (uVar12 != pdVar2->finishwid)) {
              dVar16 = ps_config_float(search->config,"fillprob");
              fsg_model_add_silence(fsg,pcVar15,-1,(float32)(float)dVar16);
            }
          }
        }
        iVar4 = ps_config_bool(config,"fsgusealtpron");
        if ((iVar4 != 0) && (fsg->altwords == (bitvec_t *)0x0)) {
          pdVar2 = search->dict;
          uVar11 = 0;
          uVar10 = (ulong)(uint)fsg->n_word;
          if (fsg->n_word < 1) {
            uVar10 = uVar11;
          }
          uVar12 = 0;
          for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
            pcVar15 = fsg->vocab[uVar11];
            uVar6 = dict_wordid(pdVar2,pcVar15);
            if (uVar6 != 0xffffffff) {
              uVar14 = (ulong)uVar6;
              while( true ) {
                pdVar3 = pdVar2->word;
                uVar6 = pdVar3[(int)uVar14].alt;
                uVar14 = (ulong)uVar6;
                if (uVar14 == 0xffffffff) break;
                if ((int)uVar6 < 0) {
                  altword = (char *)0x0;
                }
                else {
                  altword = pdVar3[uVar14].word;
                }
                iVar4 = fsg_model_add_alt(fsg,pcVar15,altword);
                uVar12 = uVar12 + iVar4;
              }
            }
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                  ,0xaa,"Added %d alternate word transitions\n",(ulong)uVar12);
        }
        iVar4 = ps_config_bool(config,"bestpath");
        if (iVar4 != 0) {
          *(undefined1 *)((long)&search[1].n_words + 1) = 1;
        }
        fsg_search_reinit(search,search->dict,search->d2p);
        ptmr_init((ptmr_t *)&search[2].name);
        return search;
      }
      pcVar15 = fsg->vocab[lVar13];
      sVar5 = dict_wordid(pdVar2,pcVar15);
      lVar13 = lVar13 + 1;
    } while (sVar5 != -1);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,0x8a,"The word \'%s\' is missing in the dictionary\n",pcVar15);
    fsg_search_free(search);
  }
  return (ps_search_t *)0x0;
}

Assistant:

ps_search_t *
fsg_search_init(const char *name,
		fsg_model_t *fsg,
                ps_config_t *config,
                acmod_t *acmod,
                dict_t *dict,
                dict2pid_t *d2p)
{
    fsg_search_t *fsgs = ckd_calloc(1, sizeof(*fsgs));
    ps_search_init(ps_search_base(fsgs), &fsg_funcs, PS_SEARCH_TYPE_FSG, name, config, acmod, dict, d2p);

    fsgs->fsg = fsg_model_retain(fsg);
    /* Initialize HMM context. */
    fsgs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                    acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (fsgs->hmmctx == NULL) {
        ps_search_free(ps_search_base(fsgs));
        return NULL;
    }

    /* Initialize the search history object */
    fsgs->history = fsg_history_init(NULL, dict);
    fsgs->frame = -1;

    /* Get search pruning parameters */
    fsgs->beam_factor = 1.0f;
    fsgs->beam = fsgs->beam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "beam"))
        >> SENSCR_SHIFT;
    fsgs->pbeam = fsgs->pbeam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "pbeam"))
        >> SENSCR_SHIFT;
    fsgs->wbeam = fsgs->wbeam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "wbeam"))
        >> SENSCR_SHIFT;

    /* LM related weights/penalties */
    fsgs->lw = ps_config_float(config, "lw");
    fsgs->pip = (int32) (logmath_log(acmod->lmath, ps_config_float(config, "pip"))
                           * fsgs->lw)
        >> SENSCR_SHIFT;
    fsgs->wip = (int32) (logmath_log(acmod->lmath, ps_config_float(config, "wip"))
                           * fsgs->lw)
        >> SENSCR_SHIFT;

    /* Acoustic score scale for posterior probabilities. */
    fsgs->ascale = 1.0 / ps_config_float(config, "ascale");

    E_INFO("FSG(beam: %d, pbeam: %d, wbeam: %d; wip: %d, pip: %d)\n",
           fsgs->beam_orig, fsgs->pbeam_orig, fsgs->wbeam_orig,
           fsgs->wip, fsgs->pip);

    if (!fsg_search_check_dict(fsgs, fsg)) {
        fsg_search_free(ps_search_base(fsgs));
        return NULL;
    }

    if (ps_config_bool(config, "fsgusefiller") &&
        !fsg_model_has_sil(fsg))
        fsg_search_add_silences(fsgs, fsg);

    if (ps_config_bool(config, "fsgusealtpron") &&
        !fsg_model_has_alt(fsg))
        fsg_search_add_altpron(fsgs, fsg);

#if __FSG_ALLOW_BESTPATH__
    /* If bestpath is enabled, hypotheses are generated from a ps_lattice_t.
     * This is not allowed by default because it tends to be very slow. */
    if (ps_config_bool(config, "bestpath"))
        fsgs->bestpath = TRUE;
#endif

    if (fsg_search_reinit(ps_search_base(fsgs),
                          ps_search_dict(fsgs),
                          ps_search_dict2pid(fsgs)) < 0)
    {
        ps_search_free(ps_search_base(fsgs));
        return NULL;
    
    }
    ptmr_init(&fsgs->perf);
        
    return ps_search_base(fsgs);
}